

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_2::CheckMemoryAccess
          (ValidationState_t *_,Instruction *inst,uint32_t index)

{
  ushort uVar1;
  StorageClass SVar2;
  uint uVar3;
  uint32_t uVar4;
  spv_result_t sVar5;
  Instruction *pIVar6;
  long lVar7;
  size_t index_00;
  char *pcVar8;
  StorageClass local_22c;
  string local_228;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 < 0x1169) {
    if (1 < uVar1 - 0x3f) {
      if (uVar1 != 0x3d) {
        if (uVar1 != 0x3e) goto switchD_0019969d_caseD_14f1;
        goto switchD_0019969d_caseD_14f0;
      }
      goto switchD_0019969d_caseD_14ef;
    }
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar6 = ValidationState_t::FindDef(_,uVar3);
    pIVar6 = ValidationState_t::FindDef(_,(pIVar6->inst_).type_id);
    SVar2 = Instruction::GetOperandAs<spv::StorageClass>(pIVar6,1);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar6 = ValidationState_t::FindDef(_,uVar3);
    pIVar6 = ValidationState_t::FindDef(_,(pIVar6->inst_).type_id);
    local_22c = Instruction::GetOperandAs<spv::StorageClass>(pIVar6,1);
  }
  else {
    switch(uVar1) {
    case 0x14f0:
    case 0x14f8:
switchD_0019969d_caseD_14f0:
      index_00 = 0;
      break;
    case 0x14f1:
    case 0x14f2:
    case 0x14f3:
    case 0x14f4:
    case 0x14f5:
    case 0x14f6:
switchD_0019969d_caseD_14f1:
      local_22c = Max;
      SVar2 = Max;
      goto LAB_00199756;
    default:
      if (uVar1 == 0x116a) goto switchD_0019969d_caseD_14f0;
      if (uVar1 != 0x1169) goto switchD_0019969d_caseD_14f1;
    case 0x14ef:
    case 0x14f7:
switchD_0019969d_caseD_14ef:
      index_00 = 2;
    }
    local_22c = Max;
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,index_00);
    pIVar6 = ValidationState_t::FindDef(_,uVar3);
    pIVar6 = ValidationState_t::FindDef(_,(pIVar6->inst_).type_id);
    SVar2 = Instruction::GetOperandAs<spv::StorageClass>(pIVar6,1);
  }
LAB_00199756:
  if ((ulong)index <
      (ulong)((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)index);
    if ((uVar3 & 8) == 0) {
LAB_0019977e:
      if ((uVar3 & 0x10) != 0) {
        uVar1 = (inst->inst_).opcode;
        if (uVar1 < 0x14f0) {
          if ((uVar1 == 0x3e) || (uVar1 == 0x116a)) {
LAB_001998fc:
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar8 = "MakePointerVisibleKHR cannot be used with OpStore.";
            lVar7 = 0x32;
            goto LAB_00199920;
          }
        }
        else if ((uVar1 == 0x14f8) || (uVar1 == 0x14f0)) goto LAB_001998fc;
        if ((uVar3 & 0x20) == 0) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"NonPrivatePointerKHR must be specified if ",0x2a);
          pcVar8 = "MakePointerVisibleKHR is specified.";
          lVar7 = 0x23;
          goto LAB_00199920;
        }
        uVar4 = GetMakeVisibleScope(inst,uVar3,index);
        sVar5 = ValidateMemoryScope(_,inst,uVar4);
        if (sVar5 != SPV_SUCCESS) {
          return sVar5;
        }
      }
      if (((uVar3 & 0x20) == 0) ||
         ((((SVar2 < (StorageBuffer|Input) && ((0x1934U >> (SVar2 & 0x1f) & 1) != 0)) ||
           (SVar2 == PhysicalStorageBuffer)) &&
          (((local_22c < (StorageBuffer|Input) && ((0x1934U >> (local_22c & 0x1f) & 1) != 0)) ||
           ((local_22c == PhysicalStorageBuffer || (local_22c == Max)))))))) {
        if ((uVar3 & 2) != 0) {
          return SPV_SUCCESS;
        }
        goto joined_r0x001997e1;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"NonPrivatePointerKHR requires a pointer in Uniform, ",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
                 ,0x3b);
      pcVar8 = "storage classes.";
      lVar7 = 0x10;
    }
    else {
      uVar1 = (inst->inst_).opcode;
      if (uVar1 < 0x14ef) {
        if ((uVar1 != 0x3d) && (uVar1 != 0x1169)) {
LAB_0019994c:
          if ((uVar3 & 0x20) != 0) {
            uVar4 = GetMakeAvailableScope(inst,uVar3,index);
            sVar5 = ValidateMemoryScope(_,inst,uVar4);
            if (sVar5 != SPV_SUCCESS) {
              return sVar5;
            }
            goto LAB_0019977e;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar8 = "NonPrivatePointerKHR must be specified if MakePointerAvailableKHR is specified."
          ;
          lVar7 = 0x4f;
          goto LAB_00199920;
        }
      }
      else if ((uVar1 != 0x14f7) && (uVar1 != 0x14ef)) goto LAB_0019994c;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar8 = "MakePointerAvailableKHR cannot be used with OpLoad.";
      lVar7 = 0x33;
    }
LAB_00199920:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar8,lVar7);
  }
  else {
joined_r0x001997e1:
    if ((SVar2 != PhysicalStorageBuffer) && (local_22c != PhysicalStorageBuffer)) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_228,_,0x1264,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Memory accesses with PhysicalStorageBuffer must use Aligned.",
               0x3c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t CheckMemoryAccess(ValidationState_t& _, const Instruction* inst,
                               uint32_t index) {
  spv::StorageClass dst_sc, src_sc;
  std::tie(dst_sc, src_sc) = GetStorageClass(_, inst);
  if (inst->operands().size() <= index) {
    // Cases where lack of some operand is invalid
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
    return SPV_SUCCESS;
  }

  const uint32_t mask = inst->GetOperandAs<uint32_t>(index);
  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerAvailableKHR)) {
    if (inst->opcode() == spv::Op::OpLoad ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadTensorNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixLoadKHR) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerAvailableKHR cannot be used with OpLoad.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
                "MakePointerAvailableKHR is specified.";
    }

    // Check the associated scope for MakeAvailableKHR.
    const auto available_scope = GetMakeAvailableScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::MakePointerVisibleKHR)) {
    if (inst->opcode() == spv::Op::OpStore ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreNV ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreKHR ||
        inst->opcode() == spv::Op::OpCooperativeMatrixStoreTensorNV) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "MakePointerVisibleKHR cannot be used with OpStore.";
    }

    if (!(mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR must be specified if "
             << "MakePointerVisibleKHR is specified.";
    }

    // Check the associated scope for MakeVisibleKHR.
    const auto visible_scope = GetMakeVisibleScope(inst, mask, index);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::MemoryAccessMask::NonPrivatePointerKHR)) {
    if (dst_sc != spv::StorageClass::Uniform &&
        dst_sc != spv::StorageClass::Workgroup &&
        dst_sc != spv::StorageClass::CrossWorkgroup &&
        dst_sc != spv::StorageClass::Generic &&
        dst_sc != spv::StorageClass::Image &&
        dst_sc != spv::StorageClass::StorageBuffer &&
        dst_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
    if (src_sc != spv::StorageClass::Max &&
        src_sc != spv::StorageClass::Uniform &&
        src_sc != spv::StorageClass::Workgroup &&
        src_sc != spv::StorageClass::CrossWorkgroup &&
        src_sc != spv::StorageClass::Generic &&
        src_sc != spv::StorageClass::Image &&
        src_sc != spv::StorageClass::StorageBuffer &&
        src_sc != spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "NonPrivatePointerKHR requires a pointer in Uniform, "
             << "Workgroup, CrossWorkgroup, Generic, Image or StorageBuffer "
             << "storage classes.";
    }
  }

  if (!(mask & uint32_t(spv::MemoryAccessMask::Aligned))) {
    if (src_sc == spv::StorageClass::PhysicalStorageBuffer ||
        dst_sc == spv::StorageClass::PhysicalStorageBuffer) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << _.VkErrorID(4708)
             << "Memory accesses with PhysicalStorageBuffer must use Aligned.";
    }
  }

  return SPV_SUCCESS;
}